

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decaf.c
# Opt level: O3

void decaf_448_point_mul_by_ratio_and_encode_like_x448(uint8_t *out,decaf_448_point_s *p)

{
  decaf_448_point_t q;
  gf_448_s gStack_160;
  gf_448_s local_120;
  gf_448_s local_e0;
  gf_448_s local_a0;
  
  memcpy(&gStack_160,p,0x100);
  gf_invert(&local_a0,&gStack_160,0);
  gf_448_mul(&local_e0,&local_a0,&local_120);
  gf_448_sqr(&local_120,&local_e0);
  gf_448_serialize(out,&local_120);
  decaf_bzero(&gStack_160,0x100);
  return;
}

Assistant:

void API_NS(point_mul_by_ratio_and_encode_like_x448) (
    uint8_t out[X_PUBLIC_BYTES],
    const point_t p
) {
    point_t q;
#if COFACTOR == 8
    point_double_internal(q,p,1);
#else
    API_NS(point_copy)(q,p);
#endif
    gf_invert(q->t,q->x,0); /* 1/x */
    gf_mul(q->z,q->t,q->y); /* y/x */
    gf_sqr(q->y,q->z); /* (y/x)^2 */
#if IMAGINE_TWIST
    gf_sub(q->y,ZERO,q->y);
#endif
    gf_serialize(out,q->y);
    API_NS(point_destroy(q));
}